

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O3

void __thiscall
chrono::fea::Brick9_Mass::Evaluate
          (Brick9_Mass *this,ChMatrixNM<double,_33,_33> *result,double x,double y,double z)

{
  ChElementHexaANCF_3813_9 *this_00;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  ActualDstType actualDst;
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  ChMatrixNM<double,_1,_3> Nz_d0;
  ChMatrixNM<double,_1,_11> Nz;
  ChMatrixNM<double,_1,_3> Ny_d0;
  ChMatrixNM<double,_1,_3> Nx_d0;
  ShapeVector N;
  ChMatrixNM<double,_1,_11> Ny;
  ChMatrixNM<double,_3,_33> S;
  ChMatrixNM<double,_1,_11> Nx;
  ChMatrixNM<double,_1,_3> local_26a0;
  ShapeVector local_2688;
  ChMatrixNM<double,_1,_3> local_2630;
  ChMatrixNM<double,_1,_3> local_2618;
  ShapeVector local_2600;
  ShapeVector local_25a8;
  Matrix<double,_3,_33,_1,_3,_33> local_2550;
  Matrix<double,_33,_33,_0,_33,_33> local_2238;
  
  this_00 = this->m_element;
  ChElementHexaANCF_3813_9::ShapeFunctions(this_00,&local_2600,x,y,z);
  lVar3 = 0;
  memset(&local_2550,0,0x318);
  auVar2 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  auVar6._8_8_ = 0xb;
  auVar6._0_8_ = 0xb;
  auVar6._16_8_ = 0xb;
  auVar6._24_8_ = 0xb;
  auVar7._8_8_ = 4;
  auVar7._0_8_ = 4;
  auVar7._16_8_ = 4;
  auVar7._24_8_ = 4;
  do {
    uVar4 = vpcmpuq_avx512vl(auVar2,auVar6,1);
    uVar4 = uVar4 & 0xf;
    auVar1 = vpaddq_avx2(auVar2,auVar2);
    auVar5._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) *
                   (long)local_2600.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.
                         m_storage.m_data.array[lVar3 + 1];
    auVar5._0_8_ = (ulong)((byte)uVar4 & 1) *
                   (long)local_2600.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.
                         m_storage.m_data.array[lVar3];
    auVar5._16_8_ =
         (ulong)((byte)(uVar4 >> 2) & 1) *
         (long)local_2600.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
               m_data.array[lVar3 + 2];
    auVar5._24_8_ =
         (uVar4 >> 3) *
         (long)local_2600.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
               m_data.array[lVar3 + 3];
    auVar1 = vpaddq_avx2(auVar1,auVar2);
    lVar3 = lVar3 + 4;
    auVar2 = vpaddq_avx2(auVar2,auVar7);
    vscatterqpd_avx512vl(ZEXT832(&local_2550) + auVar1 * (undefined1  [32])0x8,uVar4,auVar5);
    vscatterqpd_avx512vl
              (ZEXT832(&local_2550) + ZEXT832(0x110) + auVar1 * (undefined1  [32])0x8,uVar4,auVar5);
    vscatterqpd_avx512vl
              (ZEXT832(&local_2550) + ZEXT832(0x220) + auVar1 * (undefined1  [32])0x8,uVar4,auVar5);
  } while (lVar3 != 0xc);
  local_25a8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = ChElementHexaANCF_3813_9::Calc_detJ0
                  (this_00,x,y,z,(ShapeVector *)&local_2238,&local_25a8,&local_2688,&local_2618,
                   &local_2630,&local_26a0);
  local_25a8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = local_25a8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
        array[2] * this_00->m_GaussScaling;
  local_25a8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [3] = (double)&local_2550;
  local_25a8.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [5] = (double)&local_2550;
  memset(&local_2238,0,0x2208);
  local_2688.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,33,3,0,33,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,33,1,3,33>>const>,Eigen::Matrix<double,3,33,1,3,33>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,33,33,0,33,33>>
            (&local_2238,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_33,_3,_0,_33,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_33,_1,_3,_33>_>_>
              *)&local_25a8,&local_2550,(Scalar *)&local_2688);
  local_2688.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [2] = (double)&local_26a0;
  local_2688.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = (double)&local_2630;
  local_2688.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [1] = (double)&local_2618;
  local_2688.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [3] = (double)result;
  local_2630.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
       = (double)result;
  local_2618.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0]
       = (double)&local_2238;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_33,_33,_0,_33,_33>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_1>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_33,_33,_0,_33,_33>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)&local_2688);
  return;
}

Assistant:

void Brick9_Mass::Evaluate(ChMatrixNM<double, 33, 33>& result, const double x, const double y, const double z) {
    ChElementHexaANCF_3813_9::ShapeVector N;
    m_element->ShapeFunctions(N, x, y, z);

    ChMatrixNM<double, 3, 33> S;
    S.setZero();

    for (int i = 0; i < 11; i++) {
        S(0, 3 * i + 0) = N(i);
        S(1, 3 * i + 1) = N(i);
        S(2, 3 * i + 2) = N(i);
    }

    double detJ0 = m_element->Calc_detJ0(x, y, z);

    // perform  r = S'*S
    result = detJ0 * m_element->m_GaussScaling * S.transpose() * S;
}